

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamToolsIndex::GetOffset
          (BamToolsIndex *this,BamRegion *region,int64_t *offset,bool *hasAlignmentsInRegion)

{
  bool bVar1;
  size_type sVar2;
  undefined8 uVar3;
  difference_type dVar4;
  reference pBVar5;
  reference pBVar6;
  undefined1 *in_RCX;
  int64_t *in_RDX;
  int *in_RSI;
  string *in_RDI;
  BtiBlock *block_1;
  BtiBlock *previousBlock;
  BtiBlock *currentBlock;
  BtiBlock *block;
  difference_type step;
  difference_type count;
  BtiBlockConstIterator blockLast;
  BtiBlockConstIterator blockIter;
  BtiBlockConstIterator blockFirst;
  bool found;
  BtiReferenceEntry refEntry;
  vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
  *in_stack_fffffffffffffea8;
  BtiReferenceEntry *in_stack_fffffffffffffeb0;
  int64_t *this_00;
  __normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
  in_stack_fffffffffffffeb8;
  __normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
  __first;
  long in_stack_fffffffffffffec8;
  allocator *paVar7;
  __normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
  *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  BamException *in_stack_fffffffffffffef0;
  long local_d8;
  BtiReferenceEntry *in_stack_ffffffffffffff38;
  __normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
  in_stack_ffffffffffffff40;
  undefined1 local_a1;
  BtiBlock local_a0;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  undefined1 *local_20;
  int64_t *local_18;
  int *local_10;
  
  if (-1 < *in_RSI) {
    in_stack_fffffffffffffee4 = *in_RSI;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    sVar2 = std::
            vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
            ::size((vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                    *)((long)&in_RDI[1].field_2 + 8));
    if (in_stack_fffffffffffffee4 < (int)sVar2) {
      __first._M_current = &local_a0;
      BtiReferenceEntry::BtiReferenceEntry
                (in_stack_fffffffffffffeb0,(int *)in_stack_fffffffffffffea8);
      ReadReferenceEntry((BamToolsIndex *)in_stack_ffffffffffffff40._M_current,
                         in_stack_ffffffffffffff38);
      local_a1 = 0;
      this_00 = &local_a0.StartOffset;
      std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>::
      begin(in_stack_fffffffffffffea8);
      __gnu_cxx::
      __normal_iterator<BamTools::Internal::BtiBlock_const*,std::vector<BamTools::Internal::BtiBlock,std::allocator<BamTools::Internal::BtiBlock>>>
      ::__normal_iterator<BamTools::Internal::BtiBlock*>
                ((__normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                  *)this_00,
                 (__normal_iterator<BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                  *)in_stack_fffffffffffffea8);
      std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>::end
                (in_stack_fffffffffffffea8);
      __gnu_cxx::
      __normal_iterator<BamTools::Internal::BtiBlock_const*,std::vector<BamTools::Internal::BtiBlock,std::allocator<BamTools::Internal::BtiBlock>>>
      ::__normal_iterator<BamTools::Internal::BtiBlock*>
                ((__normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                  *)this_00,
                 (__normal_iterator<BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                  *)in_stack_fffffffffffffea8);
      dVar4 = std::
              distance<__gnu_cxx::__normal_iterator<BamTools::Internal::BtiBlock_const*,std::vector<BamTools::Internal::BtiBlock,std::allocator<BamTools::Internal::BtiBlock>>>>
                        (__first,in_stack_fffffffffffffeb8);
      while (local_d8 = dVar4, 0 < local_d8) {
        std::
        advance<__gnu_cxx::__normal_iterator<BamTools::Internal::BtiBlock_const*,std::vector<BamTools::Internal::BtiBlock,std::allocator<BamTools::Internal::BtiBlock>>>,long>
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        pBVar5 = __gnu_cxx::
                 __normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                 ::operator*((__normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                              *)&stack0xffffffffffffff40);
        dVar4 = local_d8 / 2;
        if (pBVar5->StartPosition <= local_10[3]) {
          if (local_10[1] < pBVar5->MaxEndPosition) {
            *local_18 = pBVar5->StartOffset;
            break;
          }
          __gnu_cxx::
          __normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
          ::operator++((__normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                        *)&stack0xffffffffffffff40);
          dVar4 = local_d8 - (local_d8 / 2 + 1);
        }
      }
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                          *)this_00,
                         (__normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                          *)in_stack_fffffffffffffea8);
      if (bVar1) {
        do {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                              *)this_00,
                             (__normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                              *)in_stack_fffffffffffffea8);
          if (!bVar1) goto LAB_0029c163;
          pBVar5 = __gnu_cxx::
                   __normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                   ::operator*((__normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                                *)&stack0xffffffffffffff40);
          __gnu_cxx::
          __normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
          ::operator--((__normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                        *)&stack0xffffffffffffff40);
          pBVar6 = __gnu_cxx::
                   __normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                   ::operator*((__normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                                *)&stack0xffffffffffffff40);
        } while (local_10[1] < pBVar6->MaxEndPosition);
        *local_18 = pBVar5->StartOffset;
        local_a1 = 1;
LAB_0029c163:
        bVar1 = __gnu_cxx::operator==
                          ((__normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                            *)this_00,
                           (__normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                            *)in_stack_fffffffffffffea8);
        if (bVar1) {
          pBVar5 = __gnu_cxx::
                   __normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                   ::operator*((__normal_iterator<const_BamTools::Internal::BtiBlock_*,_std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>_>
                                *)&stack0xffffffffffffff40);
          *local_18 = pBVar5->StartOffset;
          local_a1 = 1;
        }
      }
      *local_20 = local_a1;
      BtiReferenceEntry::~BtiReferenceEntry((BtiReferenceEntry *)0x29c1cf);
      return;
    }
  }
  local_7a = 1;
  uVar3 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"BamToolsIndex::GetOffset",&local_41);
  paVar7 = &local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"invalid region requested",paVar7);
  BamException::BamException
            (in_stack_fffffffffffffef0,in_RDI,
             (string *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  local_7a = 0;
  __cxa_throw(uVar3,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamToolsIndex::GetOffset(const BamRegion& region, int64_t& offset, bool* hasAlignmentsInRegion)
{

    // return false ref ID is not a valid index in file summary data
    if (region.LeftRefID < 0 || region.LeftRefID >= (int)m_indexFileSummary.size())
        throw BamException("BamToolsIndex::GetOffset", "invalid region requested");

    // retrieve reference index data for left bound reference
    BtiReferenceEntry refEntry(region.LeftRefID);
    ReadReferenceEntry(refEntry);

    // binary search for an overlapping block (may not be first one though)
    bool found = false;
    typedef BtiBlockVector::const_iterator BtiBlockConstIterator;
    BtiBlockConstIterator blockFirst = refEntry.Blocks.begin();
    BtiBlockConstIterator blockIter = blockFirst;
    BtiBlockConstIterator blockLast = refEntry.Blocks.end();
    std::iterator_traits<BtiBlockConstIterator>::difference_type count =
        std::distance(blockFirst, blockLast);
    std::iterator_traits<BtiBlockConstIterator>::difference_type step;
    while (count > 0) {
        blockIter = blockFirst;
        step = count / 2;
        advance(blockIter, step);

        const BtiBlock& block = (*blockIter);
        if (block.StartPosition <= region.RightPosition) {
            if (block.MaxEndPosition > region.LeftPosition) {
                offset = block.StartOffset;
                break;
            }
            blockFirst = ++blockIter;
            count -= step + 1;
        } else
            count = step;
    }

    // if we didn't search "off the end" of the blocks
    if (blockIter != blockLast) {

        // "walk back" until we've gone too far
        while (blockIter != blockFirst) {
            const BtiBlock& currentBlock = (*blockIter);

            --blockIter;
            const BtiBlock& previousBlock = (*blockIter);
            if (previousBlock.MaxEndPosition <= region.LeftPosition) {
                offset = currentBlock.StartOffset;
                found = true;
                break;
            }
        }

        // if we walked all the way to first block, just return that and let the reader's
        // region overlap parsing do the rest
        if (blockIter == blockFirst) {
            const BtiBlock& block = (*blockIter);
            offset = block.StartOffset;
            found = true;
        }
    }

    // sets to false if blocks container is empty, or if no matching block could be found
    *hasAlignmentsInRegion = found;
}